

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

int AF_A_Overlay(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  player_t *this;
  PClass *pPVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DPSprite *pDVar6;
  FState *newstate;
  char *pcVar7;
  AActor *caller;
  AActor *pAVar8;
  bool bVar9;
  PClass *pPVar5;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_0055a877;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0055a83f;
  pAVar8 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar8 == (AActor *)0x0) goto LAB_0055a627;
    pPVar5 = (pAVar8->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar3 = (**(pAVar8->super_DThinker).super_DObject._vptr_DObject)(pAVar8);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar3);
      (pAVar8->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar9 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar2 && bVar9) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar9 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar2) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0055a877;
    }
  }
  else {
    if (pAVar8 != (AActor *)0x0) goto LAB_0055a83f;
LAB_0055a627:
    pAVar8 = (AActor *)0x0;
  }
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    caller = pAVar8;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_0055a83f:
        pcVar7 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_0055a877;
      }
      caller = (AActor *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (caller != (AActor *)0x0) {
          pPVar5 = (caller->super_DThinker).super_DObject.Class;
          if (pPVar5 == (PClass *)0x0) {
            iVar3 = (**(caller->super_DThinker).super_DObject._vptr_DObject)(caller);
            pPVar5 = (PClass *)CONCAT44(extraout_var_00,iVar3);
            (caller->super_DThinker).super_DObject.Class = pPVar5;
          }
          bVar9 = pPVar5 != (PClass *)0x0;
          if (pPVar5 != pPVar2 && bVar9) {
            do {
              pPVar5 = pPVar5->ParentClass;
              bVar9 = pPVar5 != (PClass *)0x0;
              if (pPVar5 == pPVar2) break;
            } while (pPVar5 != (PClass *)0x0);
          }
          if (!bVar9) {
            pcVar7 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_0055a877;
          }
          goto LAB_0055a6d0;
        }
      }
      else if (caller != (AActor *)0x0) goto LAB_0055a83f;
      caller = (AActor *)0x0;
    }
LAB_0055a6d0:
    if (2 < numparam) {
      VVar1 = param[2].field_0.field_3.Type;
      if ((VVar1 != 0xff) &&
         ((VVar1 != '\x03' ||
          ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
        pcVar7 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
        ;
LAB_0055a877:
        __assert_fail(pcVar7,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x47b,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      if (numparam != 3) {
        if (param[3].field_0.field_3.Type != '\0') {
          pcVar7 = "param[paramnum].Type == REGT_INT";
          goto LAB_0055a858;
        }
        iVar3 = param[3].field_0.i;
        if (numparam == 4) {
          newstate = (FState *)0x0;
        }
        else {
          VVar1 = param[4].field_0.field_3.Type;
          if (VVar1 == 0xff) {
LAB_0055a751:
            newstate = (FState *)0x0;
          }
          else {
            if (VVar1 != '\x03') {
LAB_0055a8ae:
              __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                            ,0x47d,
                            "int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
            }
            newstate = (FState *)param[4].field_0.field_1.a;
            if (param[4].field_0.field_1.atag != 7) {
              if (newstate != (FState *)0x0) goto LAB_0055a8ae;
              goto LAB_0055a751;
            }
          }
          if (5 < (uint)numparam) {
            VVar1 = param[5].field_0.field_3.Type;
            if (VVar1 == '\0') {
              bVar9 = param[5].field_0.i != 0;
              goto LAB_0055a773;
            }
            if (VVar1 != 0xff) {
              __assert_fail("param[paramnum].Type == REGT_INT",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                            ,0x47e,
                            "int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
            }
          }
        }
        bVar9 = false;
LAB_0055a773:
        this = pAVar8->player;
        if ((this == (player_t *)0x0) ||
           ((bVar9 && (pDVar6 = player_t::FindPSprite(this,iVar3), pDVar6 != (DPSprite *)0x0)))) {
          if (numret < 1) {
            return 0;
          }
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                          ,0x484,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                         );
          }
          uVar4 = 0;
        }
        else {
          pDVar6 = (DPSprite *)
                   M_Malloc_Dbg(0x88,
                                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                                ,0x1f7);
          DPSprite::DPSprite(pDVar6,this,caller,iVar3);
          DPSprite::SetState(pDVar6,newstate,false);
          if (numret < 1) {
            return 0;
          }
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                          ,0x48a,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                         );
          }
          uVar4 = 1;
        }
        if (ret->RegType == '\0') {
          *(undefined4 *)ret->Location = uVar4;
          return 1;
        }
        __assert_fail("RegType == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/vm.h"
                      ,0x118,"void VMReturn::SetInt(int)");
      }
    }
  }
  pcVar7 = "(paramnum) < numparam";
LAB_0055a858:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x47c,"int AF_A_Overlay(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_Overlay)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT		(layer);
	PARAM_STATE_OPT	(state) { state = nullptr; }
	PARAM_BOOL_OPT	(dontoverride)	{ dontoverride = false; }

	player_t *player = self->player;

	if (player == nullptr || (dontoverride && (player->FindPSprite(layer) != nullptr)))
	{
		ACTION_RETURN_BOOL(false);
	}

	DPSprite *pspr;
	pspr = new DPSprite(player, stateowner, layer);
	pspr->SetState(state);
	ACTION_RETURN_BOOL(true);
}